

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<arg_res_tuple<float,_2UL>_> *
Catch::Generators::
makeGenerators<arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>>
          (arg_res_tuple<float,_2UL> *val,arg_res_tuple<float,_2UL> *moreGenerators,
          arg_res_tuple<float,_2UL> *moreGenerators_1,arg_res_tuple<float,_2UL> *moreGenerators_2,
          arg_res_tuple<float,_2UL> *moreGenerators_3,arg_res_tuple<float,_2UL> *moreGenerators_4,
          arg_res_tuple<float,_2UL> *moreGenerators_5,arg_res_tuple<float,_2UL> *moreGenerators_6,
          arg_res_tuple<float,_2UL> *moreGenerators_7,arg_res_tuple<float,_2UL> *moreGenerators_8,
          arg_res_tuple<float,_2UL> *moreGenerators_9)

{
  arg_res_tuple<float,_2UL> *unaff_RBX;
  arg_res_tuple<float,_2UL> *in_RSI;
  Generators<arg_res_tuple<float,_2UL>_> *in_RDI;
  arg_res_tuple<float,_2UL> *unaff_R12;
  arg_res_tuple<float,_2UL> *unaff_R14;
  arg_res_tuple<float,_2UL> *unaff_R15;
  Generators<arg_res_tuple<float,_2UL>_> *moreGenerators_2_00;
  arg_res_tuple<float,_2UL> *moreGenerators_1_00;
  arg_res_tuple<float,_2UL> *in_stack_ffffffffffffff98;
  GeneratorWrapper<arg_res_tuple<float,_2UL>_> *in_stack_ffffffffffffffa0;
  arg_res_tuple<float,_2UL> local_58 [3];
  Generators<arg_res_tuple<float,_2UL>_> *moreGenerators_5_00;
  
  moreGenerators_1_00 = local_58;
  moreGenerators_2_00 = in_RDI;
  moreGenerators_5_00 = in_RDI;
  value<arg_res_tuple<float,2ul>>((arg_res_tuple<float,_2UL> *)in_RDI);
  makeGenerators<arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,moreGenerators_1_00,
             (arg_res_tuple<float,_2UL> *)moreGenerators_2_00,(arg_res_tuple<float,_2UL> *)in_RDI,
             in_RSI,(arg_res_tuple<float,_2UL> *)moreGenerators_5_00,unaff_RBX,unaff_R12,unaff_R14,
             unaff_R15);
  GeneratorWrapper<arg_res_tuple<float,_2UL>_>::~GeneratorWrapper
            ((GeneratorWrapper<arg_res_tuple<float,_2UL>_> *)0x3b43b5);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }